

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8_range.cc
# Opt level: O2

void re2c::UTF8splitByContinuity(RangeSuffix **root,rune l,rune h,uint32_t n)

{
  uint uVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  
LAB_0013a841:
  bVar2 = 6;
  uVar1 = 1;
  do {
    if (n <= uVar1) {
      UTF8addContinuous(root,l,h,n);
      return;
    }
    uVar3 = -1 << (bVar2 & 0x1f);
    uVar4 = uVar3 & h;
    if ((uVar3 & l) != uVar4) {
      if ((l & ~uVar3) != 0) {
        uVar1 = ~uVar3 | l;
        UTF8splitByContinuity(root,l,uVar1,n);
        l = uVar1 + 1;
        goto LAB_0013a841;
      }
      if ((uVar3 | h) != 0xffffffff) break;
    }
    uVar1 = uVar1 + 1;
    bVar2 = bVar2 + 6;
  } while( true );
  UTF8splitByContinuity(root,l,uVar4 - 1,n);
  l = uVar4;
  goto LAB_0013a841;
}

Assistant:

void UTF8splitByContinuity(RangeSuffix * & root, utf8::rune l, utf8::rune h, uint32_t n)
{
	for (uint32_t i = 1; i < n; ++i)
	{
		uint32_t m = (1u << (6u * i)) - 1u; // last i bytes of a UTF-8 sequence
		if ((l & ~m) != (h & ~m))
		{
			if ((l & m) != 0)
			{
				UTF8splitByContinuity(root, l, l | m, n);
				UTF8splitByContinuity(root, (l | m) + 1, h, n);
				return;
			}
			if ((h & m) != m)
			{
				UTF8splitByContinuity(root, l, (h & ~m) - 1, n);
				UTF8splitByContinuity(root, h & ~m, h, n);
				return;
			}
		}
	}
	UTF8addContinuous(root, l, h, n);
}